

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::Reverse(ON_RevSurface *this,int dir)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double a1;
  double a0;
  bool rc;
  int dir_local;
  ON_RevSurface *this_local;
  
  a0._3_1_ = false;
  a0._4_4_ = dir;
  if ((this->m_bTransposed & 1U) != 0) {
    a0._4_4_ = (uint)(dir == 0);
  }
  if (a0._4_4_ == 0) {
    ON_Line::Reverse(&this->m_axis);
    pdVar3 = ON_Interval::operator[](&this->m_angle,0);
    dVar1 = *pdVar3;
    pdVar3 = ON_Interval::operator[](&this->m_angle,1);
    ON_Interval::Set(&this->m_angle,6.283185307179586 - *pdVar3,6.283185307179586 - dVar1);
    ON_Interval::Reverse(&this->m_t);
    a0._3_1_ = true;
  }
  else if ((a0._4_4_ == 1) && (this->m_curve != (ON_Curve *)0x0)) {
    iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])();
    a0._3_1_ = (bool)((byte)iVar2 & 1);
  }
  return a0._3_1_;
}

Assistant:

bool ON_RevSurface::Reverse( int dir )
{
  bool rc = false;
  if ( m_bTransposed )
    dir = dir ? 0 : 1;
  if ( dir == 0 )
  {
    m_axis.Reverse();
    double a0 = m_angle[0];
    double a1 = m_angle[1];
    m_angle.Set( 2.0*ON_PI - a1, 2.0*ON_PI - a0 );
    m_t.Reverse();
    rc = true;
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Reverse();
  }
  return rc;
}